

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_>::TPZDohrPrecond
          (TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *this,void **vtt,
          TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *origin,
          TPZAutoPointer<TPZDohrAssembly<double>_> *assemble)

{
  int iVar1;
  SubsList *__x;
  TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  TPZMatrix<double> *in_stack_ffffffffffffff90;
  void **in_stack_ffffffffffffff98;
  long *plVar2;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  *in_stack_ffffffffffffffd0;
  
  TPZMatrix<double>::TPZMatrix
            ((TPZMatrix<double> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  *in_RDI = *in_RSI;
  __x = TPZDohrMatrix<double,TPZDohrSubstructCondense<double>>::SubStructures_abi_cxx11_
                  ((TPZDohrMatrix<double,TPZDohrSubstructCondense<double>> *)in_RDX);
  std::__cxx11::
  list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  ::list(in_stack_ffffffffffffffd0,__x);
  in_RDI[7] = 0;
  plVar2 = in_RDI + 8;
  iVar1 = TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_>::NumCoarse(in_RDX);
  *plVar2 = (long)iVar1;
  *(undefined4 *)(in_RDI + 9) = 0;
  TPZAutoPointer<TPZDohrAssembly<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZDohrAssembly<double>_> *)(in_RDI + 10),
             (TPZAutoPointer<TPZDohrAssembly<double>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar1 = TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_>::NumThreads(in_RDX);
  *(int *)(in_RDI + 9) = iVar1;
  return;
}

Assistant:

TPZDohrPrecond<TVar, TSubStruct>::TPZDohrPrecond(TPZDohrMatrix<TVar, TSubStruct> &origin, TPZAutoPointer<TPZDohrAssembly<TVar> > assemble)
: TPZMatrix<TVar>(origin), fGlobal(origin.SubStructures()), fCoarse(0), fNumCoarse(origin.NumCoarse()), fNumThreads(0), fAssemble(assemble)
{
	fNumThreads = origin.NumThreads();
}